

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void chunk(LexState *ls)

{
  int iVar1;
  LexState *in_RDI;
  bool bVar2;
  int islast;
  LexState *in_stack_ffffffffffffffe8;
  int local_c;
  
  local_c = 0;
  enterlevel((LexState *)0x11235b);
  while( true ) {
    bVar2 = false;
    if (local_c == 0) {
      iVar1 = block_follow((in_RDI->t).token);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    local_c = statement(in_RDI);
    testnext(in_stack_ffffffffffffffe8,0);
    in_RDI->fs->freereg = (uint)in_RDI->fs->nactvar;
  }
  in_RDI->L->nCcalls = in_RDI->L->nCcalls - 1;
  return;
}

Assistant:

static void chunk(LexState*ls){
int islast=0;
enterlevel(ls);
while(!islast&&!block_follow(ls->t.token)){
islast=statement(ls);
testnext(ls,';');
ls->fs->freereg=ls->fs->nactvar;
}
leavelevel(ls);
}